

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall
SchnorrUtil_ComputeSigPointBatch_Test::TestBody(SchnorrUtil_ComputeSigPointBatch_Test *this)

{
  allocator<cfd::core::ByteData256> *this_00;
  allocator<cfd::core::SchnorrPubkey> *this_01;
  initializer_list<cfd::core::SchnorrPubkey> __l;
  initializer_list<cfd::core::ByteData256> __l_00;
  bool bVar1;
  size_type sVar2;
  reference msg;
  reference nonce;
  char *message;
  SchnorrPubkey *local_350;
  ByteData256 *local_308;
  AssertHelper local_2c8;
  Message local_2c0;
  string local_2b8;
  string local_298;
  undefined1 local_278 [8];
  AssertionResult gtest_ar;
  Pubkey actual_sig_point;
  Pubkey expected_sig_point;
  ulong local_220;
  size_t i;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> sig_points;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  SchnorrPubkey *local_188;
  SchnorrPubkey local_180;
  SchnorrPubkey local_168;
  SchnorrPubkey local_150;
  undefined1 local_138 [24];
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> nonces;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_a9;
  string local_a8;
  ByteData256 *local_88;
  ByteData256 local_80;
  ByteData256 local_68;
  ByteData256 local_50;
  undefined1 local_38 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> data;
  SchnorrUtil_ComputeSigPointBatch_Test *this_local;
  
  nonces.super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_88 = &local_80;
  data.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"e48441762fb75010b2aa31a512b62b4148aa3fb08eb0765d76b252559064a614",
             &local_a9);
  cfd::core::ByteData256::ByteData256(&local_80,&local_a8);
  local_88 = &local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"80a1c2125d13d6b2d639f2da507772040719d36c6228ec141befd1aecb901b17",
             &local_e1);
  cfd::core::ByteData256::ByteData256(&local_68,&local_e0);
  local_88 = &local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"375a7aec74bba181ffca89ef03bd8a10d7ddae7813190d4616652d9e91bcff20"
             ,(allocator *)
              ((long)&nonces.
                      super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_50,&local_108);
  nonces.super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_38._0_8_ = &local_80;
  local_38._8_8_ = (pointer)0x3;
  this_00 = (allocator<cfd::core::ByteData256> *)
            ((long)&nonces.
                    super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(this_00);
  __l_00._M_len = local_38._8_8_;
  __l_00._M_array = (iterator)local_38._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_38 + 0x10),__l_00,this_00);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&nonces.
                     super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_308 = (ByteData256 *)local_38;
  do {
    local_308 = local_308 + -1;
    cfd::core::ByteData256::~ByteData256(local_308);
  } while (local_308 != &local_80);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&nonces.
                     super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  sig_points.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_188 = &local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a8,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,&local_1a9);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_180,&local_1a8);
  local_188 = &local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,"f14d7e54ff58c5d019ce9986be4a0e8b7d643bd08ef2cdf1099e1a457865b547"
             ,&local_1d1);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_168,&local_1d0);
  local_188 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f8,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
             ,(allocator *)
              ((long)&sig_points.
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_150,&local_1f8);
  sig_points.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_138._0_8_ = &local_180;
  local_138._8_8_ = (pointer)0x3;
  this_01 = (allocator<cfd::core::SchnorrPubkey> *)
            ((long)&sig_points.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::SchnorrPubkey>::allocator(this_01);
  __l._M_len = local_138._8_8_;
  __l._M_array = (iterator)local_138._0_8_;
  std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::vector
            ((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)
             (local_138 + 0x10),__l,this_01);
  std::allocator<cfd::core::SchnorrPubkey>::~allocator
            ((allocator<cfd::core::SchnorrPubkey> *)
             ((long)&sig_points.
                     super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_350 = (SchnorrPubkey *)local_138;
  do {
    local_350 = local_350 + -1;
    cfd::core::SchnorrPubkey::~SchnorrPubkey(local_350);
  } while (local_350 != &local_180);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sig_points.
                     super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&i);
  for (local_220 = 0;
      sVar2 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         (local_38 + 0x10)), local_220 < sVar2; local_220 = local_220 + 1) {
    msg = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     (local_38 + 0x10),local_220);
    nonce = std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::
            operator[]((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                        *)(local_138 + 0x10),local_220);
    cfd::core::SchnorrUtil::ComputeSigPoint
              ((Pubkey *)
               &expected_sig_point.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,msg,nonce,&::pubkey);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&i,
               (value_type *)
               &expected_sig_point.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cfd::core::Pubkey::~Pubkey
              ((Pubkey *)
               &expected_sig_point.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  cfd::core::Pubkey::CombinePubkey
            ((Pubkey *)
             &actual_sig_point.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&i);
  cfd::core::SchnorrUtil::ComputeSigPointBatch
            ((Pubkey *)&gtest_ar.message_,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_38 + 0x10),
             (vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)
             (local_138 + 0x10),&::pubkey);
  cfd::core::Pubkey::GetHex_abi_cxx11_
            (&local_298,
             (Pubkey *)
             &actual_sig_point.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_2b8,(Pubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_278,"expected_sig_point.GetHex()","actual_sig_point.GetHex()",
             &local_298,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x118,message);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &actual_sig_point.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&i);
  std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::~vector
            ((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)
             (local_138 + 0x10));
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_38 + 0x10));
  return;
}

Assistant:

TEST(SchnorrUtil, ComputeSigPointBatch) {
  std::vector<ByteData256> data = {
      ByteData256(
          "e48441762fb75010b2aa31a512b62b4148aa3fb08eb0765d76b252559064a614"),
      ByteData256(
          "80a1c2125d13d6b2d639f2da507772040719d36c6228ec141befd1aecb901b17"),
      ByteData256(
          "375a7aec74bba181ffca89ef03bd8a10d7ddae7813190d4616652d9e91bcff20"),
  };

  std::vector<SchnorrPubkey> nonces = {
      SchnorrPubkey(
          "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
      SchnorrPubkey(
          "f14d7e54ff58c5d019ce9986be4a0e8b7d643bd08ef2cdf1099e1a457865b547"),
      SchnorrPubkey(
          "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")};

  std::vector<Pubkey> sig_points;
  for (size_t i = 0; i < data.size(); i++) {
    sig_points.push_back(
        SchnorrUtil::ComputeSigPoint(data[i], nonces[i], pubkey));
  }
  auto expected_sig_point = Pubkey::CombinePubkey(sig_points);

  auto actual_sig_point =
      SchnorrUtil::ComputeSigPointBatch(data, nonces, pubkey);

  ASSERT_EQ(expected_sig_point.GetHex(), actual_sig_point.GetHex());
}